

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_Initialize(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  PaUtilHostApiRepresentation *pPVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  if (initializationCount_ == 0) {
    PaUtil_InitializeClock();
    uVar6 = 0xffffffffffffffff;
    lVar7 = -0x100000000;
    do {
      lVar7 = lVar7 + 0x100000000;
      lVar1 = uVar6 * 8;
      uVar6 = uVar6 + 1;
    } while (*(long *)(__gmon_start__ + lVar1) != 0);
    hostApis_ = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar7 >> 0x1d);
    if (hostApis_ == (PaUtilHostApiRepresentation **)0x0) {
      iVar5 = -0x2708;
LAB_00104d44:
      TerminateHostApis();
    }
    else {
      iVar9 = 0;
      hostApisCount_ = 0;
      defaultHostApiIndex_ = -1;
      deviceCount_ = 0;
      if (uVar6 != 0) {
        uVar8 = 1;
        if (1 < (int)uVar6) {
          uVar8 = uVar6 & 0xffffffff;
        }
        uVar6 = 0;
        do {
          hostApis_[hostApisCount_] = (PaUtilHostApiRepresentation *)0x0;
          iVar5 = (**(code **)(&paHostApiInitializers + uVar6 * 8))();
          if (iVar5 != 0) goto LAB_00104d44;
          pPVar4 = hostApis_[hostApisCount_];
          if (pPVar4 != (PaUtilHostApiRepresentation *)0x0) {
            iVar5 = (pPVar4->info).deviceCount;
            uVar2 = (pPVar4->info).defaultInputDevice;
            if (iVar5 <= (int)uVar2) {
              __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                            ,0xc4,"PaError InitializeHostApis(void)");
            }
            uVar3 = (pPVar4->info).defaultOutputDevice;
            if (iVar5 <= (int)uVar3) {
              __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_front.c"
                            ,0xc5,"PaError InitializeHostApis(void)");
            }
            if (((uVar3 & uVar2) != 0xffffffff) && (defaultHostApiIndex_ == -1)) {
              defaultHostApiIndex_ = hostApisCount_;
            }
            (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
            if (uVar2 != 0xffffffff) {
              (pPVar4->info).defaultInputDevice = uVar2 + iVar9;
            }
            if (uVar3 != 0xffffffff) {
              (pPVar4->info).defaultOutputDevice = uVar3 + iVar9;
            }
            deviceCount_ = deviceCount_ + iVar5;
            iVar9 = iVar9 + iVar5;
            hostApisCount_ = hostApisCount_ + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      iVar5 = 0;
      if (defaultHostApiIndex_ == -1) {
        defaultHostApiIndex_ = 0;
      }
    }
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  initializationCount_ = initializationCount_ + 1;
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;
        
        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}